

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * pstore::path::posix::join
                   (string *__return_storage_ptr__,string *a,
                   initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *p)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  iterator pbVar1;
  long lVar2;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)a);
  pbVar1 = p->_M_array;
  for (lVar2 = p->_M_len << 5; lVar2 != 0; lVar2 = lVar2 + -0x20) {
    if ((pbVar1->_M_string_length == 0) || (*(pbVar1->_M_dataplus)._M_p != '/')) {
      if ((__return_storage_ptr__->_M_string_length != 0) &&
         ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1]
          != '/')) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
    pbVar1 = pbVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join (std::string const & a, std::initializer_list<std::string> const & p) {
                std::string path = a;
                for (auto const & b : p) {
                    if (starts_with (b, '/')) {
                        path = b;
                    } else if (path.empty () || ends_with (path, '/')) {
                        path += b;
                    } else {
                        path += '/';
                        path += b;
                    }
                }
                return path;
            }